

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::ClipperOffset::Execute(ClipperOffset *this,Paths *solution,double delta)

{
  const_iterator __position;
  allocator_type local_169;
  double local_168;
  Path outer;
  IntRect r;
  Clipper clpr;
  
  local_168 = delta;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::clear(solution);
  FixOrientations(this);
  DoOffset(this,local_168);
  clpr._184_8_ = 0;
  clpr._192_8_ = 0;
  clpr._200_8_ = 0;
  clpr._216_8_ = 0;
  clpr._224_8_ = 0;
  clpr._232_8_ = 0;
  clpr._248_8_ = 0;
  clpr._256_8_ = 0;
  clpr._264_8_ = 0;
  clpr._144_8_ = 0;
  clpr._152_8_ = 0;
  clpr._160_8_ = 0;
  clpr._168_8_ = 0;
  clpr._vptr_Clipper = (_func_int **)&PTR_ExecuteInternal_00183c60;
  clpr._136_8_ = &PTR__Clipper_00183ca8;
  clpr.m_Maxima.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&clpr.m_Maxima;
  clpr.m_Joins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  clpr.m_Joins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  clpr.m_Joins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clpr.m_GhostJoins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clpr.m_IntersectList.
  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clpr.m_GhostJoins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  clpr.m_GhostJoins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clpr.m_IntersectList.
  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clpr.m_IntersectList.
  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  clpr.m_Maxima.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node._M_size = 0;
  clpr.m_ExecuteLocked = false;
  clpr._176_1_ = 0;
  clpr.m_ReverseOutput = false;
  clpr.m_StrictSimple = false;
  clpr._208_2_ = 0;
  clpr.m_Maxima.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       clpr.m_Maxima.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
       super__List_node_base._M_next;
  ClipperBase::AddPaths((ClipperBase *)&clpr.field_0x88,&this->m_destPolys,ptSubject,true);
  if (local_168 <= 0.0) {
    ClipperBase::GetBounds(&r,(ClipperBase *)(clpr._vptr_Clipper[-3] + (long)&clpr));
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
              (&outer,4,&local_169);
    (outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
     super__Vector_impl_data._M_start)->X = r.left + -10;
    (outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
     super__Vector_impl_data._M_start)->Y = r.bottom + 10;
    outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
    super__Vector_impl_data._M_start[1].X = r.right + 10;
    outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
    super__Vector_impl_data._M_start[1].Y = r.bottom + 10;
    outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
    super__Vector_impl_data._M_start[2].X = r.right + 10;
    outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
    super__Vector_impl_data._M_start[2].Y = r.top + -10;
    outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
    super__Vector_impl_data._M_start[3].X = r.left + -10;
    outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
    super__Vector_impl_data._M_start[3].Y = r.top + -10;
    ClipperBase::AddPath
              ((ClipperBase *)(clpr._vptr_Clipper[-3] + (long)&clpr._vptr_Clipper),&outer,ptSubject,
               true);
    clpr.m_ReverseOutput = true;
    Clipper::Execute(&clpr,ctUnion,solution,pftNegative,pftNegative);
    __position._M_current =
         (solution->
         super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    if ((solution->
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != __position._M_current) {
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::erase(solution,__position);
    }
    std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
              (&outer.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>);
  }
  else {
    Clipper::Execute(&clpr,ctUnion,solution,pftPositive,pftPositive);
  }
  Clipper::~Clipper(&clpr);
  return;
}

Assistant:

void ClipperOffset::Execute(Paths& solution, double delta)
{
  solution.clear();
  FixOrientations();
  DoOffset(delta);
  
  //now clean up 'corners' ...
  Clipper clpr;
  clpr.AddPaths(m_destPolys, ptSubject, true);
  if (delta > 0)
  {
    clpr.Execute(ctUnion, solution, pftPositive, pftPositive);
  }
  else
  {
    IntRect r = clpr.GetBounds();
    Path outer(4);
    outer[0] = IntPoint(r.left - 10, r.bottom + 10);
    outer[1] = IntPoint(r.right + 10, r.bottom + 10);
    outer[2] = IntPoint(r.right + 10, r.top - 10);
    outer[3] = IntPoint(r.left - 10, r.top - 10);

    clpr.AddPath(outer, ptSubject, true);
    clpr.ReverseSolution(true);
    clpr.Execute(ctUnion, solution, pftNegative, pftNegative);
    if (solution.size() > 0) solution.erase(solution.begin());
  }
}